

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

char * __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::TryAllocFreePages<false>
          (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           *this,uint pageCount,PageSegmentBase<Memory::VirtualAllocWrapper> **pageSegment)

{
  size_t *psVar1;
  RealCount *pRVar2;
  undefined4 *puVar3;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *pDVar4;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *pDVar5;
  DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *pDVar6;
  code *pcVar7;
  undefined1 auVar8 [8];
  bool bVar9;
  int iVar10;
  PageSegmentBase<Memory::VirtualAllocWrapper> *this_00;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  undefined8 *in_FS_OFFSET;
  char *local_68;
  undefined1 local_48 [8];
  EditingIterator i;
  
  i.super_Iterator.current._4_4_ = pageCount;
  iVar10 = (*this->_vptr_PageAllocatorBase[3])();
  if ((char)iVar10 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x3e5,"(!HasMultiThreadAccess())","!HasMultiThreadAccess()");
    if (!bVar9) {
LAB_002625b6:
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    *puVar3 = 0;
  }
  uVar13 = (ulong)i.super_Iterator.current._4_4_;
  if (uVar13 <= this->freePageCount) {
    local_48 = (undefined1  [8])&this->segments;
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    i.super_Iterator.list =
         (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)local_48;
    do {
      if (i.super_Iterator.list ==
          (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                           ,0x66,"(current != nullptr)","current != nullptr");
        if (!bVar9) goto LAB_002625b6;
        *puVar3 = 0;
      }
      auVar8 = local_48;
      pDVar4 = ((i.super_Iterator.list)->
               super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.list
      ;
      if ((undefined1  [8])pDVar4 == local_48) {
        i.super_Iterator.list =
             (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0;
        break;
      }
      i.super_Iterator.list = pDVar4;
      this_00 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator
                ::Data((Iterator *)local_48);
      pcVar11 = PageSegmentBase<Memory::VirtualAllocWrapper>::AllocPages<false>
                          (this_00,i.super_Iterator.current._4_4_);
      if (pcVar11 != (char *)0x0) {
        this->usedBytes = this->usedBytes + uVar13 * 0x1000;
        LOCK();
        totalUsedBytes = totalUsedBytes + uVar13 * 0x1000;
        UNLOCK();
        if (maxUsedBytes < totalUsedBytes) {
          maxUsedBytes = totalUsedBytes;
        }
        if (this->memoryData != (PageMemoryData *)0x0) {
          psVar1 = &this->memoryData->allocPageCount;
          *psVar1 = *psVar1 + uVar13;
        }
        if (this_00->freePageCount == 0) {
          pDVar5 = ((i.super_Iterator.list)->
                   super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).prev.
                   list;
          (pDVar5->super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next
               = ((i.super_Iterator.list)->
                 super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next;
          (((i.super_Iterator.list)->
           super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.base)->
          prev = ((i.super_Iterator.list)->
                 super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).prev;
          pDVar6 = (this->fullSegments).
                   super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>.next.
                   base;
          ((i.super_Iterator.list)->
          super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).prev =
               pDVar6->prev;
          ((i.super_Iterator.list)->
          super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.base =
               pDVar6;
          (((pDVar6->prev).base)->next).list = i.super_Iterator.list;
          (pDVar6->prev).list = i.super_Iterator.list;
          ((RealCount *)((long)local_48 + 0x10))->count =
               ((RealCount *)((long)local_48 + 0x10))->count - 1;
          pRVar2 = &(this->fullSegments).super_RealCount;
          pRVar2->count = pRVar2->count + 1;
          i.super_Iterator.list = pDVar5;
        }
        uVar12 = this->freePageCount - uVar13;
        this->freePageCount = uVar12;
        *pageSegment = this_00;
        if (uVar12 < this->debugMinFreePageCount) {
          this->debugMinFreePageCount = uVar12;
        }
        FillAllocPages(this,pcVar11,i.super_Iterator.current._4_4_);
        local_68 = pcVar11;
      }
    } while (pcVar11 == (char *)0x0);
    if ((undefined1  [8])pDVar4 != auVar8) {
      return local_68;
    }
  }
  pcVar11 = TryAllocFromZeroPages(this,i.super_Iterator.current._4_4_,pageSegment);
  return pcVar11;
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::TryAllocFreePages(uint pageCount, TPageSegment ** pageSegment)
{
    Assert(!HasMultiThreadAccess());
    char* pages = nullptr;

    if (this->freePageCount >= pageCount)
    {
        FAULTINJECT_MEMORY_NOTHROW(this->debugName, pageCount*AutoSystemInfo::PageSize);
        typename DListBase<TPageSegment>::EditingIterator i(&this->segments);

        while (i.Next())
        {
            TPageSegment * freeSegment = &i.Data();

            pages = freeSegment->template AllocPages<notPageAligned>(pageCount);
            if (pages != nullptr)
            {
                LogAllocPages(pageCount);
                if (freeSegment->GetFreePageCount() == 0)
                {
                    i.MoveCurrentTo(&this->fullSegments);
                }

                this->freePageCount -= pageCount;
                *pageSegment = freeSegment;

#if DBG
                UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
#endif
                this->FillAllocPages(pages, pageCount);
                return pages;
            }
        }
    }

    pages = TryAllocFromZeroPages(pageCount, pageSegment);

    return pages;
}